

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entity.cpp
# Opt level: O2

void __thiscall getCommandList::test_method(getCommandList *this)

{
  string *psVar1;
  undefined8 uVar2;
  allocator<char> local_71;
  undefined **local_70;
  undefined1 local_68;
  undefined8 *local_60;
  char *local_58;
  char *local_50;
  char *local_48;
  undefined1 *local_40;
  undefined1 *local_38;
  char *local_30;
  char *local_28;
  
  psVar1 = (string *)dynamicgraph::PoolStorage::getInstance();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"my-entity",&local_71);
  dynamicgraph::PoolStorage::getEntity(psVar1);
  std::__cxx11::string::~string((string *)&local_70);
  local_30 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/entity.cpp"
  ;
  local_28 = "";
  local_40 = &boost::unit_test::basic_cstring<char_const>::null;
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_30,0xb8);
  local_68 = 0;
  local_70 = &PTR__lazy_ostream_00137970;
  local_60 = &boost::unit_test::lazy_ostream::inst;
  local_58 = "";
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/stack-of-tasks[P]dynamic-graph/tests/entity.cpp"
  ;
  local_48 = "";
  uVar2 = dynamicgraph::Entity::getCommandList_abi_cxx11_();
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,char[24]>
            (&local_70,&local_50,0xb8,1,2,uVar2,"entity.getCommandList()",
             "print\nsignals\nsignalDep","\"print\\nsignals\\nsignalDep\"");
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE(getCommandList) {
  dynamicgraph::Entity &entity =
      dynamicgraph::PoolStorage::getInstance()->getEntity("my-entity");

  BOOST_CHECK_EQUAL(entity.getCommandList(), "print\nsignals\nsignalDep");
}